

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O0

void __thiscall asl::SocketServer::start(SocketServer *this,bool nonblocking)

{
  SockServerThread *this_00;
  bool nonblocking_local;
  SocketServer *this_local;
  
  this->_running = true;
  if (nonblocking) {
    this_00 = (SockServerThread *)operator_new(0x20);
    SockServerThread::SockServerThread(this_00,this);
    this->_thread = this_00;
    Thread::start(&this->_thread->super_Thread);
  }
  else {
    startLoop(this);
  }
  return;
}

Assistant:

void SocketServer::start(bool nonblocking)
{
	_running = true;

	if(nonblocking) {
		_thread = new SockServerThread(this);
		_thread->start();
	}
	else
		startLoop();
}